

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

void __thiscall Lexer::Lexer(Lexer *this,char *input)

{
  StringPiece local_38;
  StringPiece local_28;
  char *local_18;
  char *input_local;
  Lexer *this_local;
  
  local_18 = input;
  input_local = (char *)this;
  StringPiece::StringPiece(&this->filename_);
  StringPiece::StringPiece(&this->input_);
  StringPiece::StringPiece(&local_28,"input");
  StringPiece::StringPiece(&local_38,local_18);
  Start(this,local_28,local_38);
  return;
}

Assistant:

Lexer::Lexer(const char* input) {
  Start("input", input);
}